

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderFps(CHud *this)

{
  int iVar1;
  CConfig *pCVar2;
  IClient *this_00;
  ITextRender *pIVar3;
  CTextCursor *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float FPS;
  char aBuf [32];
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  CTextCursor *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  CTextCursor *this_01;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pCVar2 = CComponent::Config((CComponent *)0x166f8a);
  if (pCVar2->m_ClShowfps != 0) {
    if (RenderFps()::s_Cursor == '\0') {
      iVar1 = __cxa_guard_acquire(&RenderFps()::s_Cursor);
      if (iVar1 != 0) {
        CTextCursor::CTextCursor(this_01,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderFps::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderFps()::s_Cursor);
      }
    }
    RenderFps::s_Cursor.m_Align = 2;
    CTextCursor::MoveTo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa8);
    this_00 = CComponent::Client((CComponent *)0x16702a);
    fVar4 = IClient::RenderFrameTime(this_00);
    (in_RDI->m_CursorPos).field_0.x =
         (in_RDI->m_CursorPos).field_0.x * (1.0 - 1.0 / (in_RDI->m_CursorPos).field_0.x) +
         (1.0 / fVar4) * (1.0 / (in_RDI->m_CursorPos).field_0.x);
    str_format(local_28,0x20,"%d",(ulong)(uint)(int)(in_RDI->m_CursorPos).field_0.x);
    CTextCursor::Reset(in_stack_ffffffffffffffb0,
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    pIVar3 = CComponent::TextRender((CComponent *)0x1670c8);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderFps::s_Cursor,local_28,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderFps()
{
	if(Config()->m_ClShowfps)
	{
		static CTextCursor s_Cursor(12);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		s_Cursor.MoveTo(m_Width-10, 5);

		// calculate avg. fps
		float FPS = 1.0f / Client()->RenderFrameTime();
		m_AverageFPS = (m_AverageFPS*(1.0f-(1.0f/m_AverageFPS))) + (FPS*(1.0f/m_AverageFPS));
		char aBuf[32];
		str_format(aBuf, sizeof(aBuf), "%d", (int)m_AverageFPS);

		s_Cursor.Reset();
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}